

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version.cpp
# Opt level: O3

bool ON_TestVersionNumber
               (uint major,uint minor,uint year,uint month,uint day_of_month,uint platform_branch,
               uint version_as_unsigned_number)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  uint version_platform;
  uint version_day_of_month;
  uint version_month;
  uint version_year;
  uint version_minor;
  uint version_major;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  if (major - 0x40 < 0xffffffc1) {
    pcVar3 = "Invalid major parameter";
    iVar4 = 0xb9;
  }
  else if (minor < 0x80) {
    if (year - 0x833 < 0xffffff9d) {
      pcVar3 = "Invalid year parameter";
      iVar4 = 0xc3;
    }
    else if (month - 0xd < 0xfffffff4) {
      pcVar3 = "Invalid month parameter";
      iVar4 = 200;
    }
    else {
      uVar2 = ON_DaysInMonthOfGregorianYear(year,month);
      if (month == 2) {
        if ((uVar2 != 0x1c) && ((uVar2 != 0x1d || ((year & 3) != 0)))) {
          pcVar3 = "ON_DaysInMonthOfGregorianYear() has bug";
          iVar4 = 0xd2;
          goto LAB_006633c0;
        }
      }
      else if (uVar2 - 0x20 < 0xfffffffe) {
        pcVar3 = "ON_DaysInMonthOfGregorianYear() has bug";
        iVar4 = 0xdb;
        goto LAB_006633c0;
      }
      if (day_of_month - 1 < uVar2) {
        uVar2 = 2 - (platform_branch & 1);
        if (platform_branch == 0) {
          uVar2 = 0;
        }
        local_38 = 0xffffffff;
        local_3c = 0xffffffff;
        local_40 = 0xffffffff;
        local_44 = 0xffffffff;
        local_48 = 0xffffffff;
        local_4c = 0xffffffff;
        if (version_as_unsigned_number == 0) {
          version_as_unsigned_number =
               ON_VersionNumberConstruct(major,minor,year,month,day_of_month,platform_branch);
        }
        local_34 = version_as_unsigned_number;
        bVar1 = ON_VersionNumberParse
                          (version_as_unsigned_number,&local_38,&local_3c,&local_40,&local_44,
                           &local_48,&local_4c);
        if (bVar1) {
          if ((((local_38 == major) && (local_3c == minor)) && (local_40 == year)) &&
             (((local_44 == month && (local_48 == day_of_month)) && (local_4c == uVar2)))) {
            uVar2 = ON_VersionNumberConstruct(major,minor,year,month,day_of_month,platform_branch);
            if (uVar2 == local_34) {
              pcVar3 = "version_as_unsigned_number != ON_VERSION_NUMBER_CTOR().";
              iVar4 = 0x129;
            }
            else {
              pcVar3 = "version_as_unsigned_number != ON_VersionNumberConstruct().";
              iVar4 = 0x122;
            }
          }
          else {
            pcVar3 = "version_as_unsigned_number does not encode version information.";
            iVar4 = 0x113;
          }
        }
        else {
          pcVar3 = "Invalid version_as_unsigned_number parameter.";
          iVar4 = 0x106;
        }
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
                   ,iVar4,"",pcVar3);
        return false;
      }
      pcVar3 = "Invalid day_of_month parameter";
      iVar4 = 0xe2;
    }
  }
  else {
    pcVar3 = "Invalid minor parameter";
    iVar4 = 0xbe;
  }
LAB_006633c0:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
             ,iVar4,"",pcVar3);
  return false;
}

Assistant:

bool ON_TestVersionNumber(
  unsigned int major,
  unsigned int minor,
  unsigned int year,
  unsigned int month,
  unsigned int day_of_month,
  unsigned int platform_branch,
  unsigned int version_as_unsigned_number
)
{
  for (;;)
  {
    if (major < 1 || major > OPENNURBS_MAX_VERSION_MAJOR)
    {
      ON_ERROR("Invalid major parameter");
      break;
    }
    if (minor > OPENNURBS_MAX_VERSION_MINOR)
    {
      ON_ERROR("Invalid minor parameter");
      break;
    }
    if (year < 2000 || year >= 2099)
    {
      ON_ERROR("Invalid year parameter");
      break;
    }
    if (month < 1 || month > 12)
    {
      ON_ERROR("Invalid month parameter");
      break;
    }
    const unsigned int max_day_of_month = ON_DaysInMonthOfGregorianYear(year, month);
    if (2 == month)
    {
      if (max_day_of_month != 28)
      {
        if (max_day_of_month != 29 || 0 != (year % 4))
        {
          ON_ERROR("ON_DaysInMonthOfGregorianYear() has bug");
          break;
        }
      }
    }
    else
    {
      if (max_day_of_month != 30 && max_day_of_month != 31)
      {
        ON_ERROR("ON_DaysInMonthOfGregorianYear() has bug");
        break;
      }
    }

    if (day_of_month < 1 || day_of_month > max_day_of_month || max_day_of_month > 31)
    {
      ON_ERROR("Invalid day_of_month parameter");
      break;
    }

    const unsigned int platform = (platform_branch > 0) ? (2 - (platform_branch % 2)) : 0;

    unsigned int version_major = 0xFFFFFFFFU;
    unsigned int version_minor = 0xFFFFFFFFU;
    unsigned int version_year = 0xFFFFFFFFU;
    unsigned int version_month = 0xFFFFFFFFU;
    unsigned int version_day_of_month = 0xFFFFFFFFU;
    unsigned int version_platform = 0xFFFFFFFFU;

    if (0 == version_as_unsigned_number)
    {
      version_as_unsigned_number = ON_VersionNumberConstruct(
        major,
        minor,
        year,
        month,
        day_of_month,
        platform_branch
      );
    }

    const bool bParsed = ON_VersionNumberParse(
      version_as_unsigned_number,
      &version_major,
      &version_minor,
      &version_year,
      &version_month,
      &version_day_of_month,
      &version_platform
      );
    if (false == bParsed)
    {
      ON_ERROR("Invalid version_as_unsigned_number parameter.");
      break;
    }

    if (
      version_major != major
      || version_minor != minor
      || version_year != year
      || version_month != month
      || version_day_of_month != day_of_month
      || version_platform != platform
      )
    {
      ON_ERROR("version_as_unsigned_number does not encode version information.");
      break;
    }

    const unsigned int version_ctor_cpp = ON_VersionNumberConstruct(
      major,
      minor,
      year,
      month,
      day_of_month,
      platform_branch
    );

    if (version_ctor_cpp != version_as_unsigned_number)
    {
      ON_ERROR("version_as_unsigned_number != ON_VersionNumberConstruct().");
      break;
    }

    const unsigned int version_ctor_macro = ON_VERSION_NUMBER_CTOR(major, minor, year, month, day_of_month, platform_branch);
    if (version_ctor_macro != version_as_unsigned_number)
    {
      ON_ERROR("version_as_unsigned_number != ON_VERSION_NUMBER_CTOR().");
      break;
    }
    return true;
  }

  return false;
}